

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test *this)

{
  iuStreamMessage *piVar1;
  iuCodeMessage *msg;
  iuStreamMessage local_3f0;
  iuCodeMessage local_268;
  undefined1 local_238 [8];
  ScopedMessage scoped_message_4;
  iuStreamMessage local_1f8;
  iuCodeMessage local_70;
  undefined1 local_40 [8];
  ScopedMessage scoped_message_3;
  iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test *this_local;
  
  scoped_message_3.super_iuCodeMessage._40_8_ = this;
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_1f8);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_1f8,(char (*) [10])"routine2.");
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
             ,0x87,piVar1);
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_40,&local_70);
  iutest::detail::iuCodeMessage::~iuCodeMessage(&local_70);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_1f8);
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_3f0);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_3f0,(char (*) [10])"routine2.");
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
             ,0x89,piVar1);
  msg = iutest::detail::iuCodeMessage::operator<<(&local_268,(char (*) [15])"iutest can do.");
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_238,msg);
  iutest::detail::iuCodeMessage::~iuCodeMessage(&local_268);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_3f0);
  Sub2(2);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_238);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_40);
  Sub2(3);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine2)
{
    {
        IUTEST_SCOPED_TRACE("routine2.");
#if !defined(IUTEST_USE_GTEST)
        IUTEST_SCOPED_TRACE("routine2.") << "iutest can do.";
#endif

        Sub2(2);
    }
    // ここの失敗には "routine2." のメッセージは表示されません。
    Sub2(3);
}